

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall
MipsParser::parseVfpuControlRegister(MipsParser *this,Parser *parser,MipsRegisterValue *reg)

{
  char *__s;
  bool bVar1;
  Token *this_00;
  Identifier *this_01;
  size_t sVar2;
  int64_t iVar3;
  char **ppcVar4;
  long lVar5;
  string_view other;
  allocator<char> local_71;
  string local_70;
  Identifier local_50;
  
  this_00 = Parser::peekToken(parser,0);
  if (this_00->type == Integer) {
    iVar3 = Token::intValue(this_00);
    if (iVar3 < 0x10) {
      iVar3 = Token::intValue(this_00);
      reg->num = (int)iVar3;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,parseVfpuControlRegister::vfpuCtrlNames[(int)iVar3],&local_71);
      Identifier::Identifier(&local_50,&local_70);
      std::__cxx11::string::operator=((string *)&reg->name,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
LAB_001596d9:
      Parser::eatToken(parser);
      return true;
    }
  }
  else {
    if (this_00->type != Identifier) {
      return false;
    }
    this_01 = Token::identifierValue(this_00);
    ppcVar4 = parseVfpuControlRegister::vfpuCtrlNames;
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      __s = *ppcVar4;
      sVar2 = strlen(__s);
      other._M_str = __s;
      other._M_len = sVar2;
      bVar1 = Identifier::operator==(this_01,other);
      if (bVar1) {
        reg->num = (int)lVar5;
        std::__cxx11::string::_M_assign((string *)&reg->name);
        goto LAB_001596d9;
      }
      ppcVar4 = ppcVar4 + 1;
    }
  }
  return false;
}

Assistant:

bool MipsParser::parseVfpuControlRegister(Parser& parser, MipsRegisterValue& reg)
{
	static const char* vfpuCtrlNames[16] = {
		"spfx", "tpfx", "dpfx", "cc",
		"inf4", "rsv5", "rsv6", "rev",
		"rcx0", "rcx1", "rcx2", "rcx3",
		"rcx4", "rcx5", "rcx6", "rcx7",
	};

	const Token& token = parser.peekToken();

	if (token.type == TokenType::Identifier)
	{
		const auto &identifier = token.identifierValue();
		for (int i = 0; i < 16; i++)
		{
			if (identifier == vfpuCtrlNames[i])
			{
				reg.num = i;
				reg.name = identifier;

				parser.eatToken();
				return true;
			}
		}
	} else if (token.type == TokenType::Integer && token.intValue() <= 15)
	{
		reg.num = (int) token.intValue();
		reg.name = Identifier(vfpuCtrlNames[reg.num]);

		parser.eatToken();
		return true;
	}

	return false;
}